

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O2

void mips_cpu_reset(CPUState *dev)

{
  (*(code *)dev[1].tb_jmp_cache[0x937])();
  memset((CPUMIPSState_conflict8 *)(dev[1].tb_jmp_cache + 0x143),0,0x3e74);
  cpu_state_reset_mips64el((CPUMIPSState_conflict8 *)(dev[1].tb_jmp_cache + 0x143));
  return;
}

Assistant:

static void mips_cpu_reset(CPUState *dev)
{
    CPUState *s = CPU(dev);
    MIPSCPU *cpu = MIPS_CPU(s);
    MIPSCPUClass *mcc = MIPS_CPU_GET_CLASS(cpu);
    CPUMIPSState *env = &cpu->env;

    mcc->parent_reset(dev);

    memset(env, 0, offsetof(CPUMIPSState, end_reset_fields));

    cpu_state_reset(env);
}